

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::loadTextFile(Player *this,string *filename)

{
  string_view delimiters;
  string_view whitespace;
  string_view line;
  string_view bracketChars;
  initializer_list<char> __l;
  string_view whitespace_00;
  string_view whitespace_01;
  string_view whitespace_02;
  string_view whitespace_03;
  string_view whitespace_04;
  string_view whitespace_05;
  string_view input;
  string_view input_00;
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  size_type sVar4;
  string *psVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  reference pvVar10;
  Time TVar11;
  long in_RDI;
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *this_00;
  size_type cloc_2;
  size_type cloc_1;
  size_type cloc;
  stringVector blk;
  int lineNumber;
  string str;
  istringstream sstr;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  int mIndex;
  int pIndex;
  int pcnt;
  int mcnt;
  vector<int,_std::allocator<int>_> cnts;
  AppTextParser aparser;
  istream *in_stack_fffffffffffff508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  App *in_stack_fffffffffffff510;
  char *in_stack_fffffffffffff518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff528;
  AppTextParser *in_stack_fffffffffffff530;
  AppTextParser *in_stack_fffffffffffff538;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff540;
  string *in_stack_fffffffffffff548;
  undefined4 in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  Time in_stack_fffffffffffff580;
  reference in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  Player *in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff5a0;
  int in_stack_fffffffffffff5a4;
  reference in_stack_fffffffffffff5a8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff610;
  AppTextParser *in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  App *in_stack_fffffffffffff6b0;
  TimeRepresentation<count_time<9,_long>_> local_8d0;
  Player *in_stack_fffffffffffff738;
  TimeRepresentation<count_time<9,_long>_> local_850;
  undefined8 local_848;
  undefined8 uStack_840;
  __sv_type local_830;
  __sv_type local_800;
  baseType local_7f0;
  size_type local_7e8;
  TimeRepresentation<count_time<9,_long>_> local_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  __sv_type local_788;
  __sv_type local_738;
  baseType local_728;
  TimeRepresentation<count_time<9,_long>_> local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  __sv_type local_700;
  __sv_type local_6d0;
  baseType local_6c0;
  size_type local_6b8;
  TimeRepresentation<count_time<9,_long>_> local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  __sv_type local_658;
  __sv_type local_608;
  baseType local_5f8;
  TimeRepresentation<count_time<9,_long>_> local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  __sv_type local_5d0;
  __sv_type local_5a0;
  baseType local_590;
  size_type local_588;
  TimeRepresentation<count_time<9,_long>_> local_560;
  __sv_type local_558;
  baseType local_548;
  TimeRepresentation<count_time<9,_long>_> local_540;
  __sv_type local_538;
  baseType local_528;
  undefined4 local_4fc;
  TimeRepresentation<count_time<9,_long>_> local_4f8;
  __sv_type local_4f0;
  baseType local_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  __sv_type local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  int local_47c;
  istringstream local_458 [396];
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  allocator<char> local_2ab;
  undefined1 local_2aa;
  undefined1 local_2a9;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  vector<int,_std::allocator<int>_> local_280;
  AppTextParser local_268;
  
  AppTextParser::AppTextParser(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  local_2aa = 0x6d;
  local_2a9 = 0x4d;
  local_2a8 = &local_2aa;
  local_2a0 = 2;
  std::allocator<char>::allocator();
  __l._M_len._0_4_ = in_stack_fffffffffffff550;
  __l._M_array = (iterator)in_stack_fffffffffffff548;
  __l._M_len._4_4_ = in_stack_fffffffffffff554;
  CLI::std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffff540,__l,(allocator_type *)in_stack_fffffffffffff538);
  AppTextParser::preParseFile(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  CLI::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff520);
  std::allocator<char>::~allocator(&local_2ab);
  pvVar3 = CLI::std::vector<int,_std::allocator<int>_>::operator[](&local_280,1);
  iVar2 = *pvVar3;
  pvVar3 = CLI::std::vector<int,_std::allocator<int>_>::operator[](&local_280,2);
  local_2c0 = iVar2 + *pvVar3;
  pvVar3 = CLI::std::vector<int,_std::allocator<int>_>::operator[](&local_280,0);
  local_2c4 = *pvVar3 - local_2c0;
  sVar4 = CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
          size((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
               (in_RDI + 0xa0));
  local_2c8 = (int)sVar4;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::size
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             (in_RDI + 0xa0));
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::resize
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
  sVar4 = CLI::std::
          vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::size
                    ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8));
  local_2cc = (int)sVar4;
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::size
            ((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
             (in_RDI + 0xb8));
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  resize((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
         in_stack_fffffffffffff530,(size_type)in_stack_fffffffffffff528);
  AppTextParser::reset((AppTextParser *)in_stack_fffffffffffff510);
  AppTextParser::configString_abi_cxx11_(&local_268);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17a3d7);
  if (!bVar1) {
    App::loadConfigOptions
              (in_stack_fffffffffffff6b0,
               (AppTextParser *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    generateParser(in_stack_fffffffffffff738);
    psVar5 = AppTextParser::configString_abi_cxx11_(&local_268);
    std::__cxx11::istringstream::istringstream(local_458,(string *)psVar5,_S_in);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x17a44d);
    CLI::App::parse_from_stream(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    std::__cxx11::istringstream::~istringstream(local_458);
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    ~unique_ptr((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
                in_stack_fffffffffffff520);
  }
  std::__cxx11::string::string(in_stack_fffffffffffff520);
  this_00 = (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
            CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590);
  do {
    bVar1 = AppTextParser::loadNextLine
                      (in_stack_fffffffffffff538,(string *)in_stack_fffffffffffff530,
                       (int *)in_stack_fffffffffffff528);
    if (!bVar1) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff510);
      CLI::std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff520);
      AppTextParser::~AppTextParser((AppTextParser *)in_stack_fffffffffffff510);
      return;
    }
    local_4a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff510);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff520,
               in_stack_fffffffffffff518);
    local_4c8 = 7;
    uStack_4c0 = 0x71452b;
    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)7;
    in_stack_fffffffffffff510 = (App *)0x71452b;
    line._M_str = (char *)in_stack_fffffffffffff528;
    line._M_len = (size_t)in_stack_fffffffffffff520;
    delimiters._M_str = in_stack_fffffffffffff518;
    delimiters._M_len = 0x71452b;
    bracketChars._M_str = (char *)in_stack_fffffffffffff548;
    bracketChars._M_len = (size_t)in_stack_fffffffffffff540;
    gmlc::utilities::stringOps::splitlineBracket_abi_cxx11_(line,delimiters,bracketChars,on);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_498,0);
    local_4d8 = 8;
    uStack_4d0 = 0x713620;
    whitespace._M_str = (char *)in_stack_fffffffffffff520;
    whitespace._M_len = (size_t)in_stack_fffffffffffff518;
    gmlc::utilities::stringOps::trimString((string *)in_stack_fffffffffffff510,whitespace);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_498,0);
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff510);
    if (*pvVar6 == 'm') {
LAB_0017a66c:
      sVar4 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_498);
      if (sVar4 == 5) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,1);
        local_4f0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff510);
        str_00._M_len._4_4_ = in_stack_fffffffffffff5a4;
        str_00._M_len._0_4_ = in_stack_fffffffffffff5a0;
        str_00._M_str = (char *)in_stack_fffffffffffff5a8;
        local_4e0 = (baseType)
                    extractTime(in_stack_fffffffffffff598,str_00,(int)((ulong)this_00 >> 0x20));
        pvVar8 = CLI::std::
                 vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
                 operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                             *)(in_RDI + 0xb8),(long)local_2cc);
        (pvVar8->sendTime).internalTimeCode = local_4e0;
        local_4f8 = TimeRepresentation<count_time<9,_long>_>::minVal();
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar8->sendTime,&local_4f8);
        if (bVar1) {
          local_4fc = 2;
          goto LAB_0017bd07;
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,2);
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff510,__str);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,3);
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff510,__str);
        pvVar8 = CLI::std::
                 vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
                 operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                             *)(in_RDI + 0xb8),(long)local_2cc);
        pvVar7 = CLI::std::
                 vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
                 operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                             *)(in_RDI + 0xb8),(long)local_2cc);
        (pvVar7->mess).time.internalTimeCode = (pvVar8->sendTime).internalTimeCode;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,4);
        decode(in_stack_fffffffffffff588);
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
        SmallBuffer::operator=
                  ((SmallBuffer *)in_stack_fffffffffffff538,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff530);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff510);
LAB_0017ac3a:
        local_2cc = local_2cc + 1;
        goto LAB_0017bcfc;
      }
      if (sVar4 != 6) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"unknown message format line ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_47c);
        std::operator<<(poVar9,'\n');
        goto LAB_0017ac3a;
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_498,1);
      local_538 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff510);
      str_01._M_len._4_4_ = in_stack_fffffffffffff5a4;
      str_01._M_len._0_4_ = in_stack_fffffffffffff5a0;
      str_01._M_str = (char *)in_stack_fffffffffffff5a8;
      local_528 = (baseType)
                  extractTime(in_stack_fffffffffffff598,str_01,(int)((ulong)this_00 >> 0x20));
      pvVar8 = CLI::std::
               vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
               operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                           *)(in_RDI + 0xb8),(long)local_2cc);
      (pvVar8->sendTime).internalTimeCode = local_528;
      local_540 = TimeRepresentation<count_time<9,_long>_>::minVal();
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar8->sendTime,&local_540);
      if (bVar1) {
        local_4fc = 2;
      }
      else {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,3);
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff510,__str);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,4);
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff510,__str);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,2);
        local_558 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff510);
        str_02._M_len._4_4_ = in_stack_fffffffffffff5a4;
        str_02._M_len._0_4_ = in_stack_fffffffffffff5a0;
        str_02._M_str = (char *)in_stack_fffffffffffff5a8;
        local_548 = (baseType)
                    extractTime(in_stack_fffffffffffff598,str_02,(int)((ulong)this_00 >> 0x20));
        pvVar8 = CLI::std::
                 vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
                 operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                             *)(in_RDI + 0xb8),(long)local_2cc);
        (pvVar8->mess).time.internalTimeCode = local_548;
        local_560 = TimeRepresentation<count_time<9,_long>_>::minVal();
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                          (&(pvVar8->mess).time,&local_560);
        if (!bVar1) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,5);
          decode(in_stack_fffffffffffff588);
          CLI::std::
          vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
          operator[]((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      *)(in_RDI + 0xb8),(long)local_2cc);
          SmallBuffer::operator=
                    ((SmallBuffer *)in_stack_fffffffffffff538,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff530);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          goto LAB_0017ac3a;
        }
        local_4fc = 2;
      }
    }
    else {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_498,0);
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
      if (*pvVar6 == 'M') goto LAB_0017a66c;
      sVar4 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_498);
      if (sVar4 == 2) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,0);
        local_588 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff510,(char)((ulong)__str >> 0x38),0x17ac8c);
        if (local_588 == 0xffffffffffffffff) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          local_5d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          local_5e8 = 8;
          uStack_5e0 = 0x713620;
          input._M_str = (char *)in_stack_fffffffffffff598;
          input._M_len = (size_t)this_00;
          whitespace_00._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_00._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input,whitespace_00);
          local_5a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          str_03._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_03._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_03._M_str = (char *)in_stack_fffffffffffff5a8;
          local_590 = (baseType)
                      extractTime(in_stack_fffffffffffff598,str_03,(int)((ulong)this_00 >> 0x20));
          pvVar10 = CLI::std::
                    vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                    operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                *)(in_RDI + 0xa0),(long)local_2c8);
          (pvVar10->time).internalTimeCode = local_590;
          local_5f0 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar10->time,&local_5f0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
LAB_0017b07e:
            if (local_2c8 < 1) {
              poVar9 = std::operator<<((ostream *)&std::cerr,
                                       "lines without publication name but follow one with a publication line "
                                      );
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_47c);
              std::operator<<(poVar9,'\n');
            }
            else {
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8 - 1);
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff510,__str);
            }
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,1);
            decode(in_stack_fffffffffffff588);
            CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            local_2c8 = local_2c8 + 1;
            goto LAB_0017bcfc;
          }
          local_4fc = 2;
        }
        else {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          local_658 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          local_668 = 8;
          uStack_660 = 0x713620;
          input_00._M_str = (char *)in_stack_fffffffffffff598;
          input_00._M_len = (size_t)this_00;
          whitespace_01._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_01._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input_00,whitespace_01);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                 (size_type)in_stack_fffffffffffff518);
          local_608 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          str_04._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_04._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_04._M_str = (char *)in_stack_fffffffffffff5a8;
          local_5f8 = (baseType)
                      extractTime(in_stack_fffffffffffff598,str_04,(int)((ulong)this_00 >> 0x20));
          pvVar10 = CLI::std::
                    vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                    operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                *)(in_RDI + 0xa0),(long)local_2c8);
          (pvVar10->time).internalTimeCode = local_5f8;
          local_670 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar10->time,&local_670);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                   (size_type)in_stack_fffffffffffff518);
            iVar2 = CLI::std::__cxx11::stoi((string *)in_stack_fffffffffffff510,(size_t *)__str,0);
            pvVar10 = CLI::std::
                      vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                    *)(in_RDI + 0xa0),(long)local_2c8);
            pvVar10->iteration = iVar2;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            goto LAB_0017b07e;
          }
          local_4fc = 2;
        }
        goto LAB_0017bd07;
      }
      sVar4 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_498);
      if (sVar4 == 3) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,0);
        local_6b8 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff510,(char)((ulong)__str >> 0x38),0x17b1ec);
        if (local_6b8 == 0xffffffffffffffff) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          local_700 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          local_718 = 8;
          uStack_710 = 0x713620;
          input_01._M_str = (char *)in_stack_fffffffffffff598;
          input_01._M_len = (size_t)this_00;
          whitespace_02._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_02._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input_01,whitespace_02);
          local_6d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          str_05._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_05._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_05._M_str = (char *)in_stack_fffffffffffff5a8;
          local_6c0 = (baseType)
                      extractTime(in_stack_fffffffffffff598,str_05,(int)((ulong)this_00 >> 0x20));
          pvVar10 = CLI::std::
                    vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                    operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                *)(in_RDI + 0xa0),(long)local_2c8);
          (pvVar10->time).internalTimeCode = local_6c0;
          local_720 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar10->time,&local_720);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
LAB_0017b5de:
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,1);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x17b5f8);
            if ((bVar1) && (0 < local_2c8)) {
              this_00 = (vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                         *)(in_RDI + 0xa0);
              pvVar10 = CLI::std::
                        vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        ::operator[](this_00,(long)local_2c8 - 1);
              in_stack_fffffffffffff598 = (Player *)&pvVar10->pubName;
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[](this_00,(long)local_2c8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff510,__str);
            }
            else {
              in_stack_fffffffffffff588 =
                   CLI::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_498,1);
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff510,__str);
            }
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,2);
            decode(in_stack_fffffffffffff588);
            CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            local_2c8 = local_2c8 + 1;
            goto LAB_0017bcfc;
          }
          local_4fc = 2;
        }
        else {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          local_788 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          local_798 = 8;
          uStack_790 = 0x713620;
          input_02._M_str = (char *)in_stack_fffffffffffff598;
          input_02._M_len = (size_t)this_00;
          whitespace_03._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_03._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input_02,whitespace_03);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                 (size_type)in_stack_fffffffffffff518);
          local_738 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          str_06._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_06._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_06._M_str = (char *)in_stack_fffffffffffff5a8;
          local_728 = (baseType)
                      extractTime(in_stack_fffffffffffff598,str_06,(int)((ulong)this_00 >> 0x20));
          in_stack_fffffffffffff5a8 =
               CLI::std::
               vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
               operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                           *)(in_RDI + 0xa0),(long)local_2c8);
          (in_stack_fffffffffffff5a8->time).internalTimeCode = local_728;
          local_7a0 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                            (&in_stack_fffffffffffff5a8->time,&local_7a0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                   (size_type)in_stack_fffffffffffff518);
            in_stack_fffffffffffff5a4 =
                 CLI::std::__cxx11::stoi((string *)in_stack_fffffffffffff510,(size_t *)__str,0);
            pvVar10 = CLI::std::
                      vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                    *)(in_RDI + 0xa0),(long)local_2c8);
            pvVar10->iteration = in_stack_fffffffffffff5a4;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            goto LAB_0017b5de;
          }
          local_4fc = 2;
        }
        goto LAB_0017bd07;
      }
      sVar4 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_498);
      if (sVar4 == 4) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_498,0);
        local_7e8 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff510,(char)((ulong)__str >> 0x38),0x17b769);
        if (local_7e8 == 0xffffffffffffffff) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          local_830 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          local_848 = 8;
          uStack_840 = 0x713620;
          input_03._M_str = (char *)in_stack_fffffffffffff598;
          input_03._M_len = (size_t)this_00;
          whitespace_04._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_04._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input_03,whitespace_04);
          local_800 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff510);
          str_07._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_07._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_07._M_str = (char *)in_stack_fffffffffffff5a8;
          in_stack_fffffffffffff580 =
               extractTime(in_stack_fffffffffffff598,str_07,(int)((ulong)this_00 >> 0x20));
          local_7f0 = in_stack_fffffffffffff580.internalTimeCode;
          pvVar10 = CLI::std::
                    vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                    operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                *)(in_RDI + 0xa0),(long)local_2c8);
          (pvVar10->time).internalTimeCode = local_7f0;
          local_850 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar10->time,&local_850);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
LAB_0017bb31:
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,1);
            bVar1 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x17bb4b);
            if ((bVar1) && (0 < local_2c8)) {
              in_stack_fffffffffffff540 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0xa0);
              pvVar10 = CLI::std::
                        vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                        ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                      *)in_stack_fffffffffffff540,(long)local_2c8 - 1);
              in_stack_fffffffffffff548 = &pvVar10->pubName;
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)in_stack_fffffffffffff540,(long)local_2c8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff510,__str);
            }
            else {
              in_stack_fffffffffffff538 =
                   (AppTextParser *)
                   CLI::std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_498,1);
              CLI::std::
              vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
              operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff510,__str);
            }
            in_stack_fffffffffffff530 =
                 (AppTextParser *)
                 CLI::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&local_498,2);
            CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffff510,__str);
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,3);
            decode(in_stack_fffffffffffff588);
            CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
            ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                          *)(in_RDI + 0xa0),(long)local_2c8);
            std::
            variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
            ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            local_2c8 = local_2c8 + 1;
            goto LAB_0017bcfc;
          }
          local_4fc = 2;
        }
        else {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_498,0);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          input_04._M_str = (char *)in_stack_fffffffffffff598;
          input_04._M_len = (size_t)this_00;
          whitespace_05._M_str = (char *)in_stack_fffffffffffff588;
          whitespace_05._M_len = in_stack_fffffffffffff580.internalTimeCode;
          gmlc::utilities::stringOps::trim_abi_cxx11_(input_04,whitespace_05);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                 (size_type)in_stack_fffffffffffff518);
          std::__cxx11::string::operator_cast_to_basic_string_view
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          str_08._M_len._4_4_ = in_stack_fffffffffffff5a4;
          str_08._M_len._0_4_ = in_stack_fffffffffffff5a0;
          str_08._M_str = (char *)in_stack_fffffffffffff5a8;
          TVar11 = extractTime(in_stack_fffffffffffff598,str_08,(int)((ulong)this_00 >> 0x20));
          pvVar10 = CLI::std::
                    vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
                    operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                *)(in_RDI + 0xa0),(long)local_2c8);
          (pvVar10->time).internalTimeCode = TVar11.internalTimeCode;
          local_8d0 = TimeRepresentation<count_time<9,_long>_>::minVal();
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pvVar10->time,&local_8d0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff510);
          if (!bVar1) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_498,0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(in_stack_fffffffffffff528,(size_type)in_stack_fffffffffffff520,
                   (size_type)in_stack_fffffffffffff518);
            iVar2 = CLI::std::__cxx11::stoi((string *)in_stack_fffffffffffff510,(size_t *)__str,0);
            pvVar10 = CLI::std::
                      vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                      ::operator[]((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                    *)(in_RDI + 0xa0),(long)local_2c8);
            pvVar10->iteration = iVar2;
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff510);
            goto LAB_0017bb31;
          }
          local_4fc = 2;
        }
        goto LAB_0017bd07;
      }
      in_stack_fffffffffffff528 =
           (string *)std::operator<<((ostream *)&std::cerr,"unknown publish format line ");
      in_stack_fffffffffffff520 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<(in_stack_fffffffffffff528,local_47c);
      std::operator<<((ostream *)in_stack_fffffffffffff520,'\n');
LAB_0017bcfc:
      local_4fc = 0;
    }
LAB_0017bd07:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff520);
  } while( true );
}

Assistant:

void Player::loadTextFile(const std::string& filename)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    AppTextParser aparser(filename);
    auto cnts = aparser.preParseFile({'m', 'M'});

    int mcnt = cnts[1] + cnts[2];
    int pcnt = cnts[0] - mcnt;
    int pIndex = static_cast<int>(points.size());
    points.resize(points.size() + pcnt);
    int mIndex = static_cast<int>(messages.size());
    messages.resize(messages.size() + mcnt);

    aparser.reset();

    if (!aparser.configString().empty()) {
        App::loadConfigOptions(aparser);
        auto app = generateParser();
        std::istringstream sstr(aparser.configString());
        app->parse_from_stream(sstr);
    }
    std::string str;
    int lineNumber;
    while (aparser.loadNextLine(str, lineNumber)) {
        /* time key type value units*/
        auto blk = splitlineBracket(str, ",\t ", default_bracket_chars, delimiter_compression::on);

        trimString(blk[0]);
        if ((blk[0].front() == 'm') || (blk[0].front() == 'M')) {
            // deal with messages
            switch (blk.size()) {
                case 5:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[2];
                    messages[mIndex].mess.dest = blk[3];
                    messages[mIndex].mess.time = messages[mIndex].sendTime;
                    messages[mIndex].mess.data = decode(std::move(blk[4]));
                    break;
                case 6:
                    if ((messages[mIndex].sendTime = extractTime(blk[1], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }

                    messages[mIndex].mess.source = blk[3];
                    messages[mIndex].mess.dest = blk[4];
                    if ((messages[mIndex].mess.time = extractTime(blk[2], lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                    messages[mIndex].mess.data = decode(std::move(blk[5]));
                    break;
                default:
                    std::cerr << "unknown message format line " << lineNumber << '\n';
                    break;
            }
            ++mIndex;
        } else {
            if (blk.size() == 2) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if (pIndex > 0) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    std::cerr
                        << "lines without publication name but follow one with a publication line "
                        << lineNumber << '\n';
                }
                points[pIndex].value = decode(std::move(blk[1]));
                ++pIndex;
            } else if (blk.size() == 3) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }

                points[pIndex].value = decode(std::move(blk[2]));
                ++pIndex;
            } else if (blk.size() == 4) {
                auto cloc = blk[0].find_last_of(':');
                if (cloc == std::string::npos) {
                    if ((points[pIndex].time = extractTime(trim(blk[0]), lineNumber)) ==
                        Time::minVal()) {
                        continue;
                    }
                } else {
                    if ((points[pIndex].time = extractTime(trim(blk[0]).substr(0, cloc),
                                                           lineNumber)) == Time::minVal()) {
                        continue;
                    }
                    points[pIndex].iteration = std::stoi(blk[0].substr(cloc + 1));
                }
                if ((blk[1].empty()) && (pIndex > 0)) {
                    points[pIndex].pubName = points[static_cast<size_t>(pIndex) - 1].pubName;
                } else {
                    points[pIndex].pubName = blk[1];
                }
                points[pIndex].type = blk[2];
                points[pIndex].value = decode(std::move(blk[3]));
                ++pIndex;
            } else {
                std::cerr << "unknown publish format line " << lineNumber << '\n';
            }
        }
    }
}